

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O2

bool icu_63::double_conversion::ConsumeSubString<char_const*>
               (char **current,char *end,char *substring)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = *current;
  pcVar4 = substring + 1;
  do {
    pcVar3 = pcVar3 + 1;
    cVar1 = *pcVar4;
    *current = pcVar3;
    if ((cVar1 == '\0') || (pcVar3 == end)) break;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar3 == cVar2);
  return cVar1 == '\0';
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}